

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  int *piVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  Layer *pLVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  void *pvVar33;
  uint _w;
  int iVar34;
  size_type sVar35;
  int iVar36;
  Option *opt_00;
  long lVar37;
  undefined1 (*pauVar38) [64];
  uint uVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [64];
  int iVar42;
  Option *_elemsize;
  ulong uVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  v4sf one;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_ZMM30 [64];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_240;
  ulong local_238;
  Mat local_208;
  ulong local_1c0;
  Mat local_1b8;
  Mat local_168;
  int local_11c;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  int local_100;
  Allocator *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  ulong local_d8;
  _func_int ***local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  int local_b8;
  int iStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  ulong local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar19;
  undefined3 uVar21;
  undefined2 uVar23;
  undefined1 auVar59 [16];
  
  auVar57 = in_ZMM30._0_16_;
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) != 0)) {
    iVar26 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  uVar28 = bottom_blob->c;
  uVar29 = (ulong)uVar28;
  uVar43 = bottom_blob->elemsize;
  iVar26 = bottom_blob->elempack;
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var2);
  iVar42 = *(int *)(&this->field_0xd8 + (long)p_Var2);
  iVar31 = *(int *)(&this->field_0xdc + (long)p_Var2);
  iVar30 = *(int *)(&this->field_0xe0 + (long)p_Var2);
  local_208.cstep = 0;
  local_208.data = (Allocator *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elempack = 0;
  local_208.elemsize._4_4_ = (int)local_208.refcount;
  local_208.allocator = (Allocator *)local_208.data;
  local_208.dims = (int)local_208.refcount;
  local_208.w = local_208.refcount._4_4_;
  local_208.h = (int)local_208.elemsize;
  local_208.d = (int)local_208.refcount;
  local_208.c = local_208.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx512 +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]),bottom_blob,&local_208,opt);
  iVar25 = local_208.w;
  iVar32 = -100;
  if (((Allocator *)local_208.data == (Allocator *)0x0) ||
     ((long)local_208.c * local_208.cstep == 0)) goto LAB_00402a1c;
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar27 = (~((iVar27 + -1) * iVar31) + local_208.w) / *(int *)(&this->field_0xe4 + (long)p_Var2);
  _w = iVar27 + 1;
  iVar42 = (~((iVar42 + -1) * iVar30) + local_208.h) / *(int *)(&this->field_0xe8 + (long)p_Var2);
  uVar40 = 1;
  if (opt->use_packing_layout == true) {
    uVar39 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
    if ((uVar39 & 0xf) == 0) {
      uVar40 = 0x10;
    }
    else if ((uVar39 & 7) == 0) {
      uVar40 = 8;
    }
    else {
      uVar40 = (ulong)((uint)((uVar39 & 3) == 0) * 3 + 1);
    }
  }
  uVar39 = (uint)uVar40;
  _elemsize = (Option *)((uVar43 / (ulong)(long)iVar26) * uVar40);
  opt_00 = _elemsize;
  Mat::create(top_blob,_w,iVar42 + 1,*(int *)(&this->field_0xd0 + (long)p_Var2) / (int)uVar39,
              (size_t)_elemsize,uVar39,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00402a1c;
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar31 = *(int *)(&this->field_0x108 + (long)p_Var2);
  if ((iVar26 * uVar28 != iVar31) || (iVar31 != *(int *)(&this->field_0xd0 + (long)p_Var2)))
  goto LAB_00401603;
  if (iVar26 < 8) {
    if (iVar26 == 1) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var2) == 3) {
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 3) &&
             (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) {
          convdw3x3s1_sse(&local_208,top_blob,&this->weight_data_tm,
                          (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
        }
        else {
          if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) != 3) ||
               ((*(int *)(&this->field_0xdc + (long)p_Var2) != 1 ||
                (*(int *)(&this->field_0xe0 + (long)p_Var2) != 1)))) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var2) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var2) != 2)) goto LAB_00401603;
          convdw3x3s2_sse(&local_208,top_blob,&this->weight_data_tm,
                          (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
        }
        goto LAB_00402611;
      }
    }
    else if (iVar26 == 4) {
      iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var2);
      if ((long)iVar26 == 3) {
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 3) &&
             (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) {
          convdw3x3s1_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
        }
        else {
          if (((iVar26 != 3) ||
              ((*(int *)(&this->field_0xd8 + (long)p_Var2) != 3 ||
               (*(int *)(&this->field_0xdc + (long)p_Var2) != 1)))) ||
             ((*(int *)(&this->field_0xe0 + (long)p_Var2) != 1 ||
              ((*(int *)(&this->field_0xe4 + (long)p_Var2) != 2 ||
               (*(int *)(&this->field_0xe8 + (long)p_Var2) != 2)))))) goto LAB_00401497;
          convdw3x3s2_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
        }
      }
      else {
LAB_00401497:
        if (iVar26 != 5) {
LAB_00401ced:
          uVar43 = (long)*(int *)(&this->field_0xd8 + (long)p_Var2) * (long)iVar26;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_168,uVar43,
                     (allocator_type *)&local_1b8);
          pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
          p_Var2 = pp_Var4[-3];
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var2)) {
            iVar26 = *(int *)(&this->field_0xe0 + (long)p_Var2);
            iVar31 = *(int *)(&this->field_0xdc + (long)p_Var2);
            iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var2);
            iVar32 = 0;
            iVar34 = 0;
            iVar36 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
                lVar37 = 0;
                do {
                  *(int *)((long)local_168.data + (iVar36 + lVar37) * 4) = iVar34;
                  iVar34 = iVar34 + *(int *)(&this->field_0xdc + (long)pp_Var4[-3]);
                  lVar37 = lVar37 + 1;
                } while ((int)lVar37 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
                iVar36 = iVar36 + (int)lVar37;
              }
              iVar34 = iVar34 + (iVar25 * iVar26 - iVar31 * iVar30);
              iVar32 = iVar32 + 1;
            } while (iVar32 < *(int *)(&this->field_0xd8 + (long)pp_Var4[-3]));
          }
          if (0 < (int)uVar28) {
            local_11c = (int)uVar43 * 4;
            iVar26 = 0;
            auVar71._8_4_ = 0x42b0c0a5;
            auVar71._0_8_ = 0x42b0c0a542b0c0a5;
            auVar71._12_4_ = 0x42b0c0a5;
            auVar72._8_4_ = 0xc2b0c0a5;
            auVar72._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar72._12_4_ = 0xc2b0c0a5;
            auVar73._8_4_ = 0x3f000000;
            auVar73._0_8_ = 0x3f0000003f000000;
            auVar73._12_4_ = 0x3f000000;
            auVar74._8_4_ = 0x3fb8aa3b;
            auVar74._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar74._12_4_ = 0x3fb8aa3b;
            auVar75._8_4_ = 0x3f800000;
            auVar75._0_8_ = 0x3f8000003f800000;
            auVar75._12_4_ = 0x3f800000;
            auVar76._8_4_ = 0x3f318000;
            auVar76._0_8_ = 0x3f3180003f318000;
            auVar76._12_4_ = 0x3f318000;
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar84._8_4_ = 0x3ab743ce;
            auVar84._0_8_ = 0x3ab743ce3ab743ce;
            auVar84._12_4_ = 0x3ab743ce;
            auVar85._8_4_ = 0x3c088908;
            auVar85._0_8_ = 0x3c0889083c088908;
            auVar85._12_4_ = 0x3c088908;
            auVar86._8_4_ = 0x3d2aa9c1;
            auVar86._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar86._12_4_ = 0x3d2aa9c1;
            auVar87._8_4_ = 0x3e2aaaaa;
            auVar87._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar87._12_4_ = 0x3e2aaaaa;
            auVar88._8_4_ = 0x3f800000;
            auVar88._0_8_ = 0x3f8000003f800000;
            auVar88._12_4_ = 0x3f800000;
            auVar89._8_4_ = 0xb95e8083;
            auVar89._0_8_ = 0xb95e8083b95e8083;
            auVar89._12_4_ = 0xb95e8083;
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
            auVar57 = vxorps_avx512vl(auVar57,auVar57);
            auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
            local_1c0 = 0;
            do {
              if (-1 < iVar42) {
                pvVar33 = (void *)(top_blob->cstep * local_1c0 * top_blob->elemsize +
                                  (long)top_blob->data);
                pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
                pvVar5 = (this->weight_data_tm).data;
                iVar31 = 0;
                do {
                  if (-1 < iVar27) {
                    uVar40 = 0;
                    do {
                      p_Var2 = pp_Var4[-3];
                      if (*(int *)(&this->field_0x100 + (long)p_Var2) == 0) {
                        auVar66 = ZEXT816(0) << 0x40;
                      }
                      else {
                        auVar66 = *(undefined1 (*) [16])
                                   (*(long *)(&this->field_0x1b0 + (long)p_Var2) + local_1c0 * 0x10)
                        ;
                      }
                      if (0 < (int)uVar43) {
                        lVar37 = 0;
                        do {
                          auVar66 = vfmadd231ps_fma(auVar66,*(undefined1 (*) [16])
                                                             ((long)pvVar5 +
                                                             lVar37 * 4 + (long)iVar26 * 4),
                                                    *(undefined1 (*) [16])
                                                     ((long)&((Allocator *)
                                                             ((long)local_208.data +
                                                             (long)*(int *)((long)local_168.data +
                                                                           lVar37) * 2 * 8))->
                                                             _vptr_Allocator +
                                                     (long)(*(int *)(&this->field_0xe4 +
                                                                    (long)p_Var2) * (int)uVar40 * 4)
                                                     * 4 + (long)*(int *)(&this->field_0xe8 +
                                                                         (long)p_Var2) *
                                                           (long)iVar31 *
                                                           (long)local_208.w *
                                                           CONCAT44(local_208.elemsize._4_4_,
                                                                    (int)local_208.elemsize) +
                                                           local_208.cstep * local_1c0 *
                                                           CONCAT44(local_208.elemsize._4_4_,
                                                                    (int)local_208.elemsize)));
                          lVar37 = lVar37 + 4;
                        } while ((uVar43 & 0xffffffff) << 2 != lVar37);
                      }
                      auVar68 = auVar66;
                      switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var2)) {
                      case 1:
                        auVar68 = vmaxps_avx512vl(auVar66,auVar57);
                        break;
                      case 2:
                        auVar68 = vmaxps_avx512vl(auVar66,auVar57);
                        auVar66 = vminps_avx512vl(auVar66,auVar57);
                        uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var2);
                        auVar16._4_4_ = uVar1;
                        auVar16._0_4_ = uVar1;
                        auVar16._8_4_ = uVar1;
                        auVar16._12_4_ = uVar1;
                        auVar68 = vfmadd132ps_avx512vl(auVar66,auVar68,auVar16);
                        break;
                      case 3:
                        uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var2);
                        auVar14._4_4_ = uVar1;
                        auVar14._0_4_ = uVar1;
                        auVar14._8_4_ = uVar1;
                        auVar14._12_4_ = uVar1;
                        auVar66 = vmaxps_avx512vl(auVar66,auVar14);
                        uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var2))[1];
                        auVar15._4_4_ = uVar1;
                        auVar15._0_4_ = uVar1;
                        auVar15._8_4_ = uVar1;
                        auVar15._12_4_ = uVar1;
                        auVar68 = vminps_avx512vl(auVar66,auVar15);
                        break;
                      case 4:
                        auVar12._8_4_ = 0x80000000;
                        auVar12._0_8_ = 0x8000000080000000;
                        auVar12._12_4_ = 0x80000000;
                        auVar66 = vxorps_avx512vl(auVar66,auVar12);
                        auVar66 = vminps_avx(auVar66,auVar71);
                        auVar68 = vmaxps_avx(auVar66,auVar72);
                        auVar61 = vfmadd231ps_fma(auVar73,auVar68,auVar74);
                        auVar94._0_4_ = (int)auVar61._0_4_;
                        auVar94._4_4_ = (int)auVar61._4_4_;
                        auVar94._8_4_ = (int)auVar61._8_4_;
                        auVar94._12_4_ = (int)auVar61._12_4_;
                        auVar66 = vcvtdq2ps_avx(auVar94);
                        uVar7 = vcmpps_avx512vl(auVar61,auVar66,1);
                        auVar61 = vsubps_avx512vl(auVar66,auVar75);
                        bVar44 = (bool)((byte)uVar7 & 1);
                        auVar67._0_4_ =
                             (float)((uint)bVar44 * auVar61._0_4_ | (uint)!bVar44 * auVar66._0_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 1) & 1);
                        auVar67._4_4_ =
                             (float)((uint)bVar44 * auVar61._4_4_ | (uint)!bVar44 * auVar66._4_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 2) & 1);
                        auVar67._8_4_ =
                             (float)((uint)bVar44 * auVar61._8_4_ | (uint)!bVar44 * auVar66._8_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 3) & 1);
                        auVar67._12_4_ =
                             (float)((uint)bVar44 * auVar61._12_4_ | (uint)!bVar44 * auVar66._12_4_)
                        ;
                        auVar66 = vfmsub231ps_fma(auVar68,auVar67,auVar76);
                        auVar13._8_4_ = 0x395e8083;
                        auVar13._0_8_ = 0x395e8083395e8083;
                        auVar13._12_4_ = 0x395e8083;
                        auVar68 = vfmsub231ps_avx512vl(auVar66,auVar67,auVar13);
                        auVar78._0_4_ = auVar68._0_4_ * auVar68._0_4_;
                        auVar78._4_4_ = auVar68._4_4_ * auVar68._4_4_;
                        auVar78._8_4_ = auVar68._8_4_ * auVar68._8_4_;
                        auVar78._12_4_ = auVar68._12_4_ * auVar68._12_4_;
                        auVar66 = vfmadd213ps_fma(auVar45,auVar68,auVar84);
                        auVar66 = vfmadd213ps_fma(auVar66,auVar68,auVar85);
                        auVar66 = vfmadd213ps_fma(auVar66,auVar68,auVar86);
                        auVar66 = vfmadd213ps_fma(auVar66,auVar68,auVar87);
                        auVar66 = vfmadd213ps_fma(auVar66,auVar68,auVar73);
                        auVar66 = vfmadd213ps_fma(auVar66,auVar78,auVar68);
                        auVar79._0_4_ = auVar66._0_4_ + 1.0;
                        auVar79._4_4_ = auVar66._4_4_ + 1.0;
                        auVar79._8_4_ = auVar66._8_4_ + 1.0;
                        auVar79._12_4_ = auVar66._12_4_ + 1.0;
                        auVar66._0_4_ = (int)auVar67._0_4_;
                        auVar66._4_4_ = (int)auVar67._4_4_;
                        auVar66._8_4_ = (int)auVar67._8_4_;
                        auVar66._12_4_ = (int)auVar67._12_4_;
                        auVar66 = vpslld_avx(auVar66,0x17);
                        auVar66 = vpaddd_avx(auVar88,auVar66);
                        auVar68 = vfmadd213ps_fma(auVar66,auVar79,auVar75);
                        auVar66 = vrcpps_avx(auVar68);
                        auVar68 = vfmsub213ps_fma(auVar68,auVar66,auVar75);
                        auVar68 = vfnmadd132ps_fma(auVar68,auVar66,auVar66);
                        break;
                      case 5:
                        auVar68 = vminps_avx(auVar66,auVar71);
                        auVar61 = vmaxps_avx(auVar68,auVar72);
                        auVar59 = vfmadd213ps_fma(auVar74,auVar61,auVar73);
                        auVar90._0_4_ = (int)auVar59._0_4_;
                        auVar90._4_4_ = (int)auVar59._4_4_;
                        auVar90._8_4_ = (int)auVar59._8_4_;
                        auVar90._12_4_ = (int)auVar59._12_4_;
                        auVar68 = vcvtdq2ps_avx(auVar90);
                        uVar7 = vcmpps_avx512vl(auVar59,auVar68,1);
                        auVar59 = vsubps_avx512vl(auVar68,auVar75);
                        bVar44 = (bool)((byte)uVar7 & 1);
                        auVar60._0_4_ =
                             (float)((uint)bVar44 * auVar59._0_4_ | (uint)!bVar44 * auVar68._0_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 1) & 1);
                        auVar60._4_4_ =
                             (float)((uint)bVar44 * auVar59._4_4_ | (uint)!bVar44 * auVar68._4_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 2) & 1);
                        auVar60._8_4_ =
                             (float)((uint)bVar44 * auVar59._8_4_ | (uint)!bVar44 * auVar68._8_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 3) & 1);
                        auVar60._12_4_ =
                             (float)((uint)bVar44 * auVar59._12_4_ | (uint)!bVar44 * auVar68._12_4_)
                        ;
                        auVar68 = vfmsub231ps_fma(auVar61,auVar60,auVar76);
                        auVar68 = vfnmsub231ps_fma(auVar68,auVar60,auVar89);
                        auVar80._0_4_ = auVar68._0_4_ * auVar68._0_4_;
                        auVar80._4_4_ = auVar68._4_4_ * auVar68._4_4_;
                        auVar80._8_4_ = auVar68._8_4_ * auVar68._8_4_;
                        auVar80._12_4_ = auVar68._12_4_ * auVar68._12_4_;
                        auVar61 = vfmadd213ps_avx512vl(auVar45,auVar68,auVar84);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar85);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar86);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar87);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar73);
                        auVar68 = vfmadd213ps_avx512vl(auVar61,auVar80,auVar68);
                        auVar61 = vaddps_avx512vl(auVar68,auVar75);
                        auVar81._0_4_ = (int)auVar60._0_4_;
                        auVar81._4_4_ = (int)auVar60._4_4_;
                        auVar81._8_4_ = (int)auVar60._8_4_;
                        auVar81._12_4_ = (int)auVar60._12_4_;
                        auVar68 = vpslld_avx(auVar81,0x17);
                        auVar68 = vpaddd_avx(auVar68,auVar88);
                        auVar68 = vfmadd213ps_fma(auVar68,auVar61,auVar75);
                        uVar7 = vcmpps_avx512vl(auVar68,auVar57,2);
                        auVar9._8_4_ = 0x800000;
                        auVar9._0_8_ = 0x80000000800000;
                        auVar9._12_4_ = 0x800000;
                        auVar68 = vmaxps_avx512vl(auVar68,auVar9);
                        auVar59 = vpsrld_avx(auVar68,0x17);
                        auVar91._8_4_ = 0x807fffff;
                        auVar91._0_8_ = 0x807fffff807fffff;
                        auVar91._12_4_ = 0x807fffff;
                        auVar10._8_4_ = 0x3f000000;
                        auVar10._0_8_ = 0x3f0000003f000000;
                        auVar10._12_4_ = 0x3f000000;
                        auVar68 = vpternlogd_avx512vl(auVar68,auVar91,auVar10,0xea);
                        uVar8 = vcmpps_avx512vl(auVar68,auVar46,1);
                        auVar61 = vaddps_avx512vl(auVar68,auVar47);
                        auVar68 = vaddps_avx512vl(auVar61,auVar68);
                        bVar44 = (bool)((byte)uVar8 & 1);
                        auVar62._0_4_ =
                             (float)((uint)bVar44 * auVar68._0_4_ | (uint)!bVar44 * auVar61._0_4_);
                        bVar44 = (bool)((byte)(uVar8 >> 1) & 1);
                        auVar62._4_4_ =
                             (float)((uint)bVar44 * auVar68._4_4_ | (uint)!bVar44 * auVar61._4_4_);
                        bVar44 = (bool)((byte)(uVar8 >> 2) & 1);
                        auVar62._8_4_ =
                             (float)((uint)bVar44 * auVar68._8_4_ | (uint)!bVar44 * auVar61._8_4_);
                        bVar44 = (bool)((byte)(uVar8 >> 3) & 1);
                        auVar62._12_4_ =
                             (float)((uint)bVar44 * auVar68._12_4_ | (uint)!bVar44 * auVar61._12_4_)
                        ;
                        auVar77._0_4_ = auVar62._0_4_ * auVar62._0_4_;
                        auVar77._4_4_ = auVar62._4_4_ * auVar62._4_4_;
                        auVar77._8_4_ = auVar62._8_4_ * auVar62._8_4_;
                        auVar77._12_4_ = auVar62._12_4_ * auVar62._12_4_;
                        auVar68 = vfmadd213ps_avx512vl(auVar48,auVar62,auVar49);
                        auVar68 = vfmadd213ps_avx512vl(auVar68,auVar62,auVar50);
                        auVar68 = vfmadd213ps_avx512vl(auVar68,auVar62,auVar51);
                        auVar68 = vfmadd213ps_avx512vl(auVar68,auVar62,auVar52);
                        auVar68 = vfmadd213ps_avx512vl(auVar68,auVar62,auVar53);
                        auVar68 = vfmadd213ps_avx512vl(auVar68,auVar62,auVar54);
                        auVar68 = vfmadd213ps_avx512vl(auVar68,auVar62,auVar55);
                        auVar68 = vfmadd213ps_avx512vl(auVar68,auVar62,auVar56);
                        auVar61 = vmulps_avx512vl(auVar77,auVar62);
                        auVar61 = vmulps_avx512vl(auVar61,auVar68);
                        auVar11._8_4_ = 0xffffff82;
                        auVar11._0_8_ = 0xffffff82ffffff82;
                        auVar11._12_4_ = 0xffffff82;
                        auVar68 = vpaddd_avx512vl(auVar59,auVar11);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        auVar59 = vsubps_avx512vl(auVar68,auVar75);
                        bVar44 = (bool)((byte)uVar8 & 1);
                        auVar63._0_4_ = (uint)bVar44 * auVar59._0_4_ | (uint)!bVar44 * auVar68._0_4_
                        ;
                        bVar44 = (bool)((byte)(uVar8 >> 1) & 1);
                        auVar63._4_4_ = (uint)bVar44 * auVar59._4_4_ | (uint)!bVar44 * auVar68._4_4_
                        ;
                        bVar44 = (bool)((byte)(uVar8 >> 2) & 1);
                        auVar63._8_4_ = (uint)bVar44 * auVar59._8_4_ | (uint)!bVar44 * auVar68._8_4_
                        ;
                        bVar44 = (bool)((byte)(uVar8 >> 3) & 1);
                        auVar63._12_4_ =
                             (uint)bVar44 * auVar59._12_4_ | (uint)!bVar44 * auVar68._12_4_;
                        auVar68 = vfmadd231ps_avx512vl(auVar61,auVar63,auVar89);
                        auVar68 = vfmsub231ps_avx512vl(auVar68,auVar73,auVar77);
                        auVar68 = vsubps_avx512vl(auVar68,auVar62);
                        auVar68 = vfnmadd231ps_fma(auVar68,auVar76,auVar63);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        bVar44 = (bool)((byte)uVar7 & 1);
                        auVar64._0_4_ =
                             (uint)bVar44 * auVar61._0_4_ |
                             (uint)!bVar44 * (int)(auVar68._0_4_ + auVar68._0_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 1) & 1);
                        auVar64._4_4_ =
                             (uint)bVar44 * auVar61._4_4_ |
                             (uint)!bVar44 * (int)(auVar68._4_4_ + auVar68._4_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 2) & 1);
                        auVar64._8_4_ =
                             (uint)bVar44 * auVar61._8_4_ |
                             (uint)!bVar44 * (int)(auVar68._8_4_ + auVar68._8_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 3) & 1);
                        auVar64._12_4_ =
                             (uint)bVar44 * auVar61._12_4_ |
                             (uint)!bVar44 * (int)(auVar68._12_4_ + auVar68._12_4_);
                        auVar68 = vminps_avx(auVar64,auVar71);
                        auVar61 = vmaxps_avx(auVar68,auVar72);
                        auVar59 = vfmadd213ps_fma(auVar74,auVar61,auVar73);
                        auVar92._0_4_ = (int)auVar59._0_4_;
                        auVar92._4_4_ = (int)auVar59._4_4_;
                        auVar92._8_4_ = (int)auVar59._8_4_;
                        auVar92._12_4_ = (int)auVar59._12_4_;
                        auVar68 = vcvtdq2ps_avx(auVar92);
                        uVar7 = vcmpps_avx512vl(auVar59,auVar68,1);
                        auVar59 = vsubps_avx512vl(auVar68,auVar75);
                        bVar44 = (bool)((byte)uVar7 & 1);
                        auVar65._0_4_ =
                             (float)((uint)bVar44 * auVar59._0_4_ | (uint)!bVar44 * auVar68._0_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 1) & 1);
                        auVar65._4_4_ =
                             (float)((uint)bVar44 * auVar59._4_4_ | (uint)!bVar44 * auVar68._4_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 2) & 1);
                        auVar65._8_4_ =
                             (float)((uint)bVar44 * auVar59._8_4_ | (uint)!bVar44 * auVar68._8_4_);
                        bVar44 = (bool)((byte)(uVar7 >> 3) & 1);
                        auVar65._12_4_ =
                             (float)((uint)bVar44 * auVar59._12_4_ | (uint)!bVar44 * auVar68._12_4_)
                        ;
                        auVar68 = vfmsub231ps_fma(auVar61,auVar65,auVar76);
                        auVar68 = vfnmsub231ps_fma(auVar68,auVar65,auVar89);
                        auVar82._0_4_ = auVar68._0_4_ * auVar68._0_4_;
                        auVar82._4_4_ = auVar68._4_4_ * auVar68._4_4_;
                        auVar82._8_4_ = auVar68._8_4_ * auVar68._8_4_;
                        auVar82._12_4_ = auVar68._12_4_ * auVar68._12_4_;
                        auVar61 = vfmadd213ps_avx512vl(auVar45,auVar68,auVar84);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar85);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar86);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar87);
                        auVar61 = vfmadd213ps_avx512vl(auVar61,auVar68,auVar73);
                        auVar68 = vfmadd213ps_avx512vl(auVar61,auVar82,auVar68);
                        auVar61 = vaddps_avx512vl(auVar68,auVar75);
                        auVar83._0_4_ = (int)auVar65._0_4_;
                        auVar83._4_4_ = (int)auVar65._4_4_;
                        auVar83._8_4_ = (int)auVar65._8_4_;
                        auVar83._12_4_ = (int)auVar65._12_4_;
                        auVar68 = vpslld_avx(auVar83,0x17);
                        auVar68 = vpaddd_avx(auVar68,auVar88);
                        auVar61 = vfmadd213ps_fma(auVar68,auVar61,auVar75);
                        auVar68 = vrcpps_avx(auVar61);
                        auVar93._0_4_ = auVar68._0_4_ + auVar68._0_4_;
                        auVar93._4_4_ = auVar68._4_4_ + auVar68._4_4_;
                        auVar93._8_4_ = auVar68._8_4_ + auVar68._8_4_;
                        auVar93._12_4_ = auVar68._12_4_ + auVar68._12_4_;
                        auVar61 = vfmsub213ps_avx512vl(auVar61,auVar93,auVar58);
                        auVar68 = vfnmadd213ps_fma(auVar61,auVar68,auVar93);
                        auVar68 = vfmsub231ps_fma(auVar66,auVar66,auVar68);
                        break;
                      case 6:
                        uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var2);
                        auVar59._4_4_ = uVar1;
                        auVar59._0_4_ = uVar1;
                        auVar59._8_4_ = uVar1;
                        auVar59._12_4_ = uVar1;
                        uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var2))[1];
                        auVar61._4_4_ = uVar1;
                        auVar61._0_4_ = uVar1;
                        auVar61._8_4_ = uVar1;
                        auVar61._12_4_ = uVar1;
                        auVar68 = vfmadd213ps_avx512vl(auVar59,auVar66,auVar61);
                        auVar68 = vmaxps_avx512vl(auVar68,auVar57);
                        auVar61 = vminps_avx(auVar68,auVar75);
                        auVar68._0_4_ = auVar61._0_4_ * auVar66._0_4_;
                        auVar68._4_4_ = auVar61._4_4_ * auVar66._4_4_;
                        auVar68._8_4_ = auVar61._8_4_ * auVar66._8_4_;
                        auVar68._12_4_ = auVar61._12_4_ * auVar66._12_4_;
                      }
                      *(undefined1 (*) [16])((long)pvVar33 + uVar40 * 0x10) = auVar68;
                      uVar40 = uVar40 + 1;
                    } while (uVar40 != _w);
                  }
                  pvVar33 = (void *)((long)pvVar33 + (long)(int)(_w * 4) * 4);
                  bVar44 = iVar31 != iVar42;
                  iVar31 = iVar31 + 1;
                } while (bVar44);
              }
              local_1c0 = local_1c0 + 1;
              iVar26 = iVar26 + local_11c;
            } while (local_1c0 != uVar29);
          }
          goto LAB_00402893;
        }
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 5) &&
             (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) {
          convdw5x5s1_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
        }
        else {
          if (((*(int *)(&this->field_0xd8 + (long)p_Var2) != 5) ||
              ((*(int *)(&this->field_0xdc + (long)p_Var2) != 1 ||
               (*(int *)(&this->field_0xe0 + (long)p_Var2) != 1)))) ||
             ((*(int *)(&this->field_0xe4 + (long)p_Var2) != 2 ||
              (*(int *)(&this->field_0xe8 + (long)p_Var2) != 2)))) goto LAB_00401ced;
          convdw5x5s2_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
        }
      }
      goto LAB_00402611;
    }
LAB_00401603:
    uVar43 = (long)(int)(iVar26 * uVar28) / (long)iVar31;
    uVar29 = (long)*(int *)(&this->field_0xd0 + (long)p_Var2) / (long)iVar31;
    iVar27 = 1;
    uVar28 = 1;
    if (opt->use_packing_layout == true) {
      uVar28 = 0x10;
      iVar27 = 0x10;
      if ((uVar43 & 0xf) != 0) {
        if ((uVar43 & 7) == 0) {
          iVar27 = 8;
        }
        else {
          iVar27 = (uint)((uVar43 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar29 & 0xf) != 0) {
        if ((uVar29 & 7) == 0) {
          uVar28 = 8;
        }
        else {
          uVar28 = (uint)((uVar29 & 3) == 0) * 3 + 1;
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
    local_168.data = local_208.data;
    local_168.refcount._0_4_ = (int)local_208.refcount;
    local_168.refcount._4_4_ = local_208.refcount._4_4_;
    local_168.elemsize._0_4_ = (int)local_208.elemsize;
    local_168.elemsize._4_4_ = local_208.elemsize._4_4_;
    local_168.elempack = local_208.elempack;
    local_168.allocator = local_208.allocator;
    local_168.w = local_208.w;
    local_168.dims = local_208.dims;
    local_168.d = local_208.d;
    local_168.h = local_208.h;
    local_168.c = local_208.c;
    local_168.cstep = local_208.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (iVar27 < iVar26) {
      local_1b8.data = *(void **)opt;
      uVar17 = opt->openmp_blocktime;
      uVar18 = opt->use_winograd_convolution;
      uVar20 = opt->use_sgemm_convolution;
      uVar22 = opt->use_int8_inference;
      uVar24 = opt->use_vulkan_compute;
      uVar23 = CONCAT11(uVar24,uVar22);
      uVar21 = CONCAT21(uVar23,uVar20);
      uVar19 = CONCAT31(uVar21,uVar18);
      local_1b8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1b8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      local_1b8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1b8.c._0_1_ = opt->use_winograd43_convolution;
      local_1b8.c._1_1_ = opt->use_winograd63_convolution;
      local_1b8.c._2_1_ = opt->use_a53_a55_optimized_kernel;
      local_1b8.c._3_1_ = opt->use_reserved_7;
      local_1b8._60_1_ = opt->use_reserved_8;
      local_1b8._61_1_ = opt->use_reserved_9;
      local_1b8._62_1_ = opt->use_reserved_10;
      local_1b8._63_1_ = opt->use_reserved_11;
      local_1b8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      local_1b8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_1b8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      local_1b8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_1b8.elempack = uVar17;
      local_1b8._28_4_ = uVar19;
      convert_packing(&local_208,&local_168,iVar27,(Option *)&local_1b8);
    }
    piVar3 = top_blob->refcount;
    local_1b8.data = top_blob->data;
    local_1b8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1b8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_1b8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_1b8.elempack = top_blob->elempack;
    local_1b8.allocator = top_blob->allocator;
    local_1b8.dims = top_blob->dims;
    local_1b8.w = top_blob->w;
    local_1b8.h = top_blob->h;
    local_1b8.d = top_blob->d;
    local_1b8.c = top_blob->c;
    local_1b8.cstep = top_blob->cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (uVar28 < uVar39) {
      Mat::create(&local_1b8,_w,iVar42 + 1,
                  *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]
                          ) / (int)uVar28,(ulong)uVar28 * ((ulong)_elemsize / uVar40),uVar28,
                  opt->workspace_allocator);
      iVar32 = -100;
      if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0))
      goto LAB_0040184c;
    }
    else {
LAB_0040184c:
      if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]))
      {
        iVar42 = 0;
        iVar26 = 0;
        lVar37 = 0;
        do {
          local_88 = CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize);
          local_c8 = (_func_int ***)
                     ((long)(_func_int ***)local_168.data +
                     (long)(iVar42 / iVar27) * local_168.cstep * local_88);
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = (int)local_168.elemsize;
          iStack_b4 = local_168.elemsize._4_4_;
          local_b0 = local_168.elempack;
          local_a8 = local_168.allocator;
          local_88 = ((long)local_168.d * local_88 * (long)local_168.h * (long)local_168.w + 0xf &
                     0xfffffffffffffff0) / local_88;
          local_a0._0_4_ = local_168.dims;
          local_a0._4_4_ = local_168.w;
          uStack_98._0_4_ = local_168.h;
          uStack_98._4_4_ = local_168.d;
          local_d8 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          local_118 = (void *)((long)(iVar26 / (int)uVar28) * local_1b8.cstep * local_d8 +
                              (long)local_1b8.data);
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = (undefined4)local_1b8.elemsize;
          uStack_104 = local_1b8.elemsize._4_4_;
          local_100 = local_1b8.elempack;
          local_f8 = local_1b8.allocator;
          local_d8 = ((long)local_1b8.d * local_d8 * (long)local_1b8.h * (long)local_1b8.w + 0xf &
                     0xfffffffffffffff0) / local_d8;
          local_f0._0_4_ = local_1b8.dims;
          local_f0._4_4_ = local_1b8.w;
          uStack_e8._0_4_ = local_1b8.h;
          uStack_e8._4_4_ = local_1b8.d;
          pLVar6 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar37];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          pAStack_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          uStack_58._0_1_ = opt->use_bf16_storage;
          uStack_58._1_1_ = opt->use_fp16_packed;
          uStack_58._2_1_ = opt->use_fp16_storage;
          uStack_58._3_1_ = opt->use_fp16_arithmetic;
          uStack_58._4_1_ = opt->use_int8_packed;
          uStack_58._5_1_ = opt->use_int8_storage;
          uStack_58._6_1_ = opt->use_int8_arithmetic;
          uStack_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          pAStack_70 = local_1b8.allocator;
          local_e0 = (int)uVar29 / (int)uVar28;
          local_90 = (int)uVar43 / iVar27;
          (*pLVar6->_vptr_Layer[7])(pLVar6,&local_c8,&local_118,&local_78);
          piVar3 = (int *)CONCAT44(uStack_10c,uStack_110);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_f8 == (Allocator *)0x0) {
                if (local_118 != (void *)0x0) {
                  free(local_118);
                }
              }
              else {
                (*local_f8->_vptr_Allocator[3])();
              }
            }
          }
          local_d8 = 0;
          local_118 = (void *)0x0;
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = 0;
          uStack_104 = 0;
          local_100 = 0;
          local_f0 = 0;
          uStack_e8 = 0;
          local_e0 = 0;
          piVar3 = (int *)CONCAT44(uStack_bc,uStack_c0);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_a8 == (Allocator *)0x0) {
                if (local_c8 != (_func_int ***)0x0) {
                  free(local_c8);
                }
              }
              else {
                (*local_a8->_vptr_Allocator[3])();
              }
            }
          }
          local_88 = 0;
          local_c8 = (_func_int ***)0x0;
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = 0;
          iStack_b4 = 0;
          local_b0 = 0;
          local_a0 = 0;
          uStack_98 = 0;
          local_90 = 0;
          lVar37 = lVar37 + 1;
          iVar26 = iVar26 + (int)uVar29;
          iVar42 = iVar42 + (int)uVar43;
        } while (lVar37 < *(int *)(&this->field_0x108 +
                                  (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      }
      if (uVar28 < uVar39) {
        iVar32 = 0;
        convert_packing(&local_1b8,top_blob,uVar39,opt);
      }
      else {
        iVar32 = 0;
        if (&local_1b8 != top_blob) {
          piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_1b8.data;
          top_blob->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          top_blob->elempack = local_1b8.elempack;
          top_blob->allocator = local_1b8.allocator;
          top_blob->dims = local_1b8.dims;
          top_blob->w = local_1b8.w;
          top_blob->h = local_1b8.h;
          top_blob->d = local_1b8.d;
          top_blob->c = local_1b8.c;
          top_blob->cstep = local_1b8.cstep;
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8._56_8_ = local_1b8._56_8_ & 0xffffffff00000000;
    piVar3 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_168.data != (Allocator *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    goto LAB_00402a1c;
  }
  if (iVar26 == 8) {
    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var2);
    if ((long)iVar26 == 3) {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 3) &&
           (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) {
        convdw3x3s1_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
      else {
        if ((((iVar26 != 3) ||
             ((*(int *)(&this->field_0xd8 + (long)p_Var2) != 3 ||
              (*(int *)(&this->field_0xdc + (long)p_Var2) != 1)))) ||
            (*(int *)(&this->field_0xe0 + (long)p_Var2) != 1)) ||
           ((*(int *)(&this->field_0xe4 + (long)p_Var2) != 2 ||
            (*(int *)(&this->field_0xe8 + (long)p_Var2) != 2)))) goto LAB_00401c37;
        convdw3x3s2_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
      goto LAB_00402611;
    }
LAB_00401c37:
    if (iVar26 == 5) {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 5) &&
           (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) {
        convdw5x5s1_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
      else {
        if (((*(int *)(&this->field_0xd8 + (long)p_Var2) != 5) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var2) != 1 ||
             (*(int *)(&this->field_0xe0 + (long)p_Var2) != 1)))) ||
           ((*(int *)(&this->field_0xe4 + (long)p_Var2) != 2 ||
            (*(int *)(&this->field_0xe8 + (long)p_Var2) != 2)))) goto LAB_00402631;
        convdw5x5s2_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
      goto LAB_00402611;
    }
LAB_00402631:
    sVar35 = (long)*(int *)(&this->field_0xd8 + (long)p_Var2) * (long)iVar26;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_168,sVar35,(allocator_type *)&local_1b8);
    pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
    p_Var2 = pp_Var4[-3];
    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var2)) {
      iVar26 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      iVar31 = *(int *)(&this->field_0xdc + (long)p_Var2);
      iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var2);
      iVar32 = 0;
      iVar34 = 0;
      iVar36 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
          lVar37 = 0;
          do {
            *(int *)((long)local_168.data + (iVar36 + lVar37) * 4) = iVar34;
            iVar34 = iVar34 + *(int *)(&this->field_0xdc + (long)pp_Var4[-3]);
            lVar37 = lVar37 + 1;
          } while ((int)lVar37 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
          iVar36 = iVar36 + (int)lVar37;
        }
        iVar34 = iVar34 + (iVar25 * iVar26 - iVar31 * iVar30);
        iVar32 = iVar32 + 1;
      } while (iVar32 < *(int *)(&this->field_0xd8 + (long)pp_Var4[-3]));
    }
    if (0 < (int)uVar28) {
      iVar31 = (int)sVar35 * 8;
      local_1c0 = CONCAT44(local_1c0._4_4_,iVar31);
      iVar26 = 0;
      local_240 = 0;
      do {
        if (-1 < iVar42) {
          pvVar33 = (void *)(top_blob->cstep * local_240 * top_blob->elemsize + (long)top_blob->data
                            );
          pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
          pvVar5 = (this->weight_data_tm).data;
          iVar30 = 0;
          do {
            if (-1 < iVar27) {
              uVar43 = 0;
              do {
                p_Var2 = pp_Var4[-3];
                if (*(int *)(&this->field_0x100 + (long)p_Var2) == 0) {
                  auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar69 = ZEXT3264(*(undefined1 (*) [32])
                                      (*(long *)(&this->field_0x1b0 + (long)p_Var2) +
                                      local_240 * 0x20));
                }
                auVar70 = auVar69._0_32_;
                if (0 < (int)sVar35) {
                  lVar37 = 0;
                  do {
                    auVar57 = vfmadd231ps_fma(auVar69._0_32_,
                                              *(undefined1 (*) [32])
                                               ((long)&((Allocator *)
                                                       ((long)local_208.data +
                                                       (long)*(int *)((long)local_168.data + lVar37)
                                                       * 4 * 8))->_vptr_Allocator +
                                               (long)(*(int *)(&this->field_0xe4 + (long)p_Var2) *
                                                      (int)uVar43 * 8) * 4 +
                                               (long)*(int *)(&this->field_0xe8 + (long)p_Var2) *
                                               (long)iVar30 *
                                               (long)local_208.w *
                                               CONCAT44(local_208.elemsize._4_4_,
                                                        (int)local_208.elemsize) +
                                               local_208.cstep * local_240 *
                                               CONCAT44(local_208.elemsize._4_4_,
                                                        (int)local_208.elemsize)),
                                              *(undefined1 (*) [32])
                                               ((long)pvVar5 + lVar37 * 8 + (long)iVar26 * 4));
                    auVar69 = ZEXT1664(auVar57);
                    auVar70 = ZEXT1632(auVar57);
                    lVar37 = lVar37 + 4;
                  } while ((sVar35 & 0xffffffff) << 2 != lVar37);
                }
                *(undefined1 (*) [32])((long)pvVar33 + uVar43 * 0x20) = auVar70;
                uVar43 = uVar43 + 1;
              } while (uVar43 != _w);
            }
            pvVar33 = (void *)((long)pvVar33 + (long)(int)(_w * 8) * 4);
            bVar44 = iVar30 != iVar42;
            iVar30 = iVar30 + 1;
          } while (bVar44);
        }
        local_240 = local_240 + 1;
        iVar26 = iVar26 + iVar31;
      } while (local_240 != uVar29);
    }
    pLVar6 = this->activation;
    if (pLVar6 != (Layer *)0x0) {
      (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
    }
LAB_00402893:
    if (local_168.data != (void *)0x0) {
      operator_delete(local_168.data,
                      CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize) -
                      (long)local_168.data);
    }
  }
  else {
    if (iVar26 != 0x10) goto LAB_00401603;
    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var2);
    if ((long)iVar26 == 3) {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 3) &&
           (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) {
        convdw3x3s1_pack16_avx512
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
      else {
        if (((iVar26 != 3) ||
            ((*(int *)(&this->field_0xd8 + (long)p_Var2) != 3 ||
             (*(int *)(&this->field_0xdc + (long)p_Var2) != 1)))) ||
           ((*(int *)(&this->field_0xe0 + (long)p_Var2) != 1 ||
            ((*(int *)(&this->field_0xe4 + (long)p_Var2) != 2 ||
             (*(int *)(&this->field_0xe8 + (long)p_Var2) != 2)))))) goto LAB_0040154d;
        convdw3x3s2_pack16_avx512
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
    }
    else {
LAB_0040154d:
      if (iVar26 != 5) {
LAB_00402382:
        sVar35 = (long)*(int *)(&this->field_0xd8 + (long)p_Var2) * (long)iVar26;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_168,sVar35,
                   (allocator_type *)&local_1b8);
        pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
        p_Var2 = pp_Var4[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var2)) {
          iVar26 = *(int *)(&this->field_0xe0 + (long)p_Var2);
          iVar31 = *(int *)(&this->field_0xdc + (long)p_Var2);
          iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var2);
          iVar32 = 0;
          iVar34 = 0;
          iVar36 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3])) {
              lVar37 = 0;
              do {
                *(int *)((long)local_168.data + (iVar32 + lVar37) * 4) = iVar34;
                iVar34 = iVar34 + *(int *)(&this->field_0xdc + (long)pp_Var4[-3]);
                lVar37 = lVar37 + 1;
              } while ((int)lVar37 < *(int *)(&this->field_0xd4 + (long)pp_Var4[-3]));
              iVar32 = iVar32 + (int)lVar37;
            }
            iVar34 = iVar34 + (iVar25 * iVar26 - iVar31 * iVar30);
            iVar36 = iVar36 + 1;
          } while (iVar36 < *(int *)(&this->field_0xd8 + (long)pp_Var4[-3]));
        }
        if (0 < (int)uVar28) {
          iVar26 = 0;
          local_238 = 0;
          do {
            if (-1 < iVar42) {
              pauVar41 = (undefined1 (*) [64])
                         (top_blob->cstep * local_238 * top_blob->elemsize + (long)top_blob->data);
              pp_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx512;
              pvVar33 = (this->weight_data_tm).data;
              iVar31 = 0;
              do {
                if (-1 < iVar27) {
                  iVar30 = 0;
                  do {
                    p_Var2 = pp_Var4[-3];
                    if (*(int *)(&this->field_0x100 + (long)p_Var2) == 0) {
                      auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar69 = *(undefined1 (*) [64])
                                 (*(long *)(&this->field_0x1b0 + (long)p_Var2) + local_238 * 0x40);
                    }
                    if (0 < (int)sVar35) {
                      uVar43 = 0;
                      pauVar38 = (undefined1 (*) [64])((long)iVar26 * 4 + (long)pvVar33);
                      do {
                        auVar69 = vfmadd231ps_avx512f(auVar69,*(undefined1 (*) [64])
                                                               ((long)&((Allocator *)
                                                                       ((long)local_208.data +
                                                                       (long)*(int *)((long)
                                                  local_168.data + uVar43 * 4) * 8 * 8))->
                                                  _vptr_Allocator +
                                                  (long)(*(int *)(&this->field_0xe4 + (long)p_Var2)
                                                         * iVar30 * 0x10) * 4 +
                                                  (long)*(int *)(&this->field_0xe8 + (long)p_Var2) *
                                                  (long)iVar31 *
                                                  (long)local_208.w *
                                                  CONCAT44(local_208.elemsize._4_4_,
                                                           (int)local_208.elemsize) +
                                                  local_208.cstep * local_238 *
                                                  CONCAT44(local_208.elemsize._4_4_,
                                                           (int)local_208.elemsize)),*pauVar38);
                        uVar43 = uVar43 + 1;
                        pauVar38 = pauVar38 + 1;
                      } while ((sVar35 & 0xffffffff) != uVar43);
                    }
                    *pauVar41 = auVar69;
                    pauVar41 = pauVar41 + 1;
                    bVar44 = iVar30 != iVar27;
                    iVar30 = iVar30 + 1;
                  } while (bVar44);
                }
                bVar44 = iVar31 != iVar42;
                iVar31 = iVar31 + 1;
              } while (bVar44);
            }
            local_238 = local_238 + 1;
            iVar26 = iVar26 + (int)sVar35 * 0x10;
          } while (local_238 != uVar29);
        }
        pLVar6 = this->activation;
        if (pLVar6 != (Layer *)0x0) {
          (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
        }
        goto LAB_00402893;
      }
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) == 5) &&
           (*(int *)(&this->field_0xdc + (long)p_Var2) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var2) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var2) == 1)))) {
        convdw5x5s1_pack16_avx512
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
      else {
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var2) != 5) ||
             ((*(int *)(&this->field_0xdc + (long)p_Var2) != 1 ||
              (*(int *)(&this->field_0xe0 + (long)p_Var2) != 1)))) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var2) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var2) != 2)) goto LAB_00402382;
        convdw5x5s2_pack16_avx512
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var2),opt_00);
      }
    }
LAB_00402611:
    pLVar6 = this->activation;
    if (pLVar6 != (Layer *)0x0) {
      (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
    }
  }
  iVar32 = 0;
LAB_00402a1c:
  piVar3 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_208.data != (Allocator *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar32;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}